

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_event_trigger.c
# Opt level: O0

void event_init(event_ctx_impl *ctx)

{
  int iVar1;
  ievent *piVar2;
  ievent *piVar3;
  ievent *e_next;
  ievent *e_curr;
  event_ctx_impl *ctx_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&ctx->mutex);
  piVar2 = ctx->ea->e + ctx->event_idx % ctx->ea->cnt;
  iVar1 = ctx->event_idx + 1;
  ctx->event_idx = iVar1;
  piVar3 = ctx->ea->e + iVar1 % ctx->ea->cnt;
  _mpp_log_l(4,0,"curr %d, next %d\n",0,piVar2->idx,piVar3->idx);
  if (piVar2->idx < piVar3->idx) {
    ctx->semval = piVar3->idx - piVar2->idx;
  }
  else if (ctx->ea->loop < 1) {
    ctx->flag = 0;
  }
  else {
    ctx->semval = (piVar3->idx + ctx->ea->loop) - piVar2->idx;
  }
  _mpp_log_l(4,0,"semval %u\n","event_init",ctx->semval);
  pthread_mutex_unlock((pthread_mutex_t *)&ctx->mutex);
  return;
}

Assistant:

static void event_init(struct event_ctx_impl *ctx)
{
    struct ievent *e_curr;
    struct ievent *e_next;

    pthread_mutex_lock(&ctx->mutex);
    e_curr = &ctx->ea->e[ctx->event_idx % ctx->ea->cnt];
    e_next = &ctx->ea->e[(++ctx->event_idx) % ctx->ea->cnt];

    mpp_log("curr %d, next %d\n",
            e_curr->idx, e_next->idx);

    if (e_next->idx > e_curr->idx)
        ctx->semval = e_next->idx - e_curr->idx;
    else if (ctx->ea->loop > 0)
        ctx->semval = e_next->idx + ctx->ea->loop - e_curr->idx;
    else
        ctx->flag = 0;

    mpp_log_f("semval %u\n", ctx->semval);
    pthread_mutex_unlock(&ctx->mutex);
}